

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFMatrix.cc
# Opt level: O2

string * __thiscall QPDFMatrix::unparse_abi_cxx11_(string *__return_storage_ptr__,QPDFMatrix *this)

{
  undefined1 in_CL;
  string sStack_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  QUtil::double_to_string_abi_cxx11_
            (&local_38,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->a) < 1e-05) & (ulong)this->a),1,
             (bool)in_CL);
  std::operator+(&local_158,&local_38," ");
  QUtil::double_to_string_abi_cxx11_
            (&local_178,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->b) < 1e-05) & (ulong)this->b),1,
             (bool)in_CL);
  std::operator+(&local_138,&local_158,&local_178);
  std::operator+(&local_118,&local_138," ");
  QUtil::double_to_string_abi_cxx11_
            (&local_198,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->c) < 1e-05) & (ulong)this->c),1,
             (bool)in_CL);
  std::operator+(&local_f8,&local_118,&local_198);
  std::operator+(&local_d8,&local_f8," ");
  QUtil::double_to_string_abi_cxx11_
            (&local_1b8,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->d) < 1e-05) & (ulong)this->d),1,
             (bool)in_CL);
  std::operator+(&local_b8,&local_d8,&local_1b8);
  std::operator+(&local_98,&local_b8," ");
  QUtil::double_to_string_abi_cxx11_
            (&local_1d8,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->e) < 1e-05) & (ulong)this->e),1,
             (bool)in_CL);
  std::operator+(&local_78,&local_98,&local_1d8);
  std::operator+(&local_58,&local_78," ");
  QUtil::double_to_string_abi_cxx11_
            (&sStack_1f8,(QUtil *)0x5,(double)(~-(ulong)(ABS(this->f) < 1e-05) & (ulong)this->f),1,
             (bool)in_CL);
  std::operator+(__return_storage_ptr__,&local_58,&sStack_1f8);
  std::__cxx11::string::~string((string *)&sStack_1f8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFMatrix::unparse() const
{
    return (
        QUtil::double_to_string(fix_rounding(a), 5) + " " +
        QUtil::double_to_string(fix_rounding(b), 5) + " " +
        QUtil::double_to_string(fix_rounding(c), 5) + " " +
        QUtil::double_to_string(fix_rounding(d), 5) + " " +
        QUtil::double_to_string(fix_rounding(e), 5) + " " +
        QUtil::double_to_string(fix_rounding(f), 5));
}